

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O2

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample2D
          (SampleVerifier *this,IVec3 *texelBase,Vec2 *weights,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  FloatFormat *this_00;
  double *pdVar1;
  int j;
  long lVar2;
  long lVar3;
  Vec4 *pVVar4;
  Vec4 *pVVar5;
  Interval *x;
  Vec4 *pVVar6;
  int i;
  Vec4 *pVVar7;
  int compNdx;
  long lVar8;
  float fVar9;
  Interval local_1b0;
  Vec4 *local_198;
  Interval jWeightInterval;
  Interval iWeightInterval;
  undefined1 local_160 [16];
  undefined1 auStack_150 [8];
  Interval resultIntervals [4];
  Vec4 texelsMax [4];
  Vec4 texelsMin [4];
  Interval local_60;
  Interval local_48;
  
  lVar2 = 0;
  local_198 = resultMin;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)texelsMin[0].m_data + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)texelsMax[0].m_data + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  pVVar4 = texelsMax;
  pVVar6 = texelsMin;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    pVVar5 = pVVar6;
    pVVar7 = pVVar4;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      iWeightInterval._0_4_ = SUB84(lVar2,0);
      iWeightInterval._4_4_ = SUB84(lVar3,0);
      iWeightInterval.m_lo._0_4_ = 0;
      tcu::operator+((tcu *)resultIntervals,texelBase,(Vector<int,_3> *)&iWeightInterval);
      fetchTexel(this,(IVec3 *)resultIntervals,layer,level,VK_FILTER_LINEAR,pVVar5,pVVar7);
      pVVar7 = pVVar7 + 2;
      pVVar5 = pVVar5 + 2;
    }
    pVVar4 = pVVar4 + 1;
    pVVar6 = pVVar6 + 1;
  }
  lVar2 = 8;
  do {
    auStack_150[lVar2] = 0;
    *(undefined8 *)(&resultIntervals[0].m_hasNaN + lVar2) = 0x7ff0000000000000;
    *(undefined8 *)((long)&resultIntervals[0].m_lo + lVar2) = 0xfff0000000000000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x68);
  for (lVar2 = 8; lVar2 != 0x68; lVar2 = lVar2 + 0x18) {
    auStack_150[lVar2] = 0;
    *(undefined8 *)(&resultIntervals[0].m_hasNaN + lVar2) = 0;
    *(undefined8 *)((long)&resultIntervals[0].m_lo + lVar2) = 0;
  }
  this_00 = &this->m_filteringPrecision;
  pVVar4 = texelsMax;
  pVVar6 = texelsMin;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar9 = weights->m_data[1];
    if (lVar2 == 0) {
      fVar9 = 1.0 - fVar9;
    }
    jWeightInterval.m_hasNaN = NAN(fVar9);
    jWeightInterval.m_lo = INFINITY;
    if (!jWeightInterval.m_hasNaN) {
      jWeightInterval.m_lo = (double)fVar9;
    }
    jWeightInterval.m_hi = -INFINITY;
    if (!jWeightInterval.m_hasNaN) {
      jWeightInterval.m_hi = (double)fVar9;
    }
    tcu::FloatFormat::roundOut(&iWeightInterval,this_00,&jWeightInterval,false);
    pVVar5 = pVVar4;
    pVVar7 = pVVar6;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fVar9 = weights->m_data[0];
      if (lVar3 == 0) {
        fVar9 = 1.0 - fVar9;
      }
      local_1b0.m_hasNaN = NAN(fVar9);
      local_1b0.m_lo = INFINITY;
      if (!local_1b0.m_hasNaN) {
        local_1b0.m_lo = (double)fVar9;
      }
      local_1b0.m_hi = -INFINITY;
      if (!local_1b0.m_hasNaN) {
        local_1b0.m_hi = (double)fVar9;
      }
      tcu::operator*((Interval *)local_160,&iWeightInterval,&local_1b0);
      tcu::FloatFormat::roundOut(&jWeightInterval,this_00,(Interval *)local_160,false);
      x = resultIntervals;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        local_160[0] = false;
        unique0x100000b1 = SUB84((double)pVVar5->m_data[lVar8],0);
        local_160._8_8_ = (double)pVVar7->m_data[lVar8];
        unique0x100000b5 = (int)((ulong)(double)pVVar5->m_data[lVar8] >> 0x20);
        tcu::operator*(&local_60,&jWeightInterval,(Interval *)local_160);
        tcu::operator+(&local_48,x,&local_60);
        tcu::FloatFormat::roundOut(&local_1b0,this_00,&local_48,false);
        x->m_hi = local_1b0.m_hi;
        *(ulong *)x = CONCAT71(local_1b0._1_7_,local_1b0.m_hasNaN);
        x->m_lo = local_1b0.m_lo;
        x = x + 1;
      }
      pVVar5 = pVVar5 + 1;
      pVVar7 = pVVar7 + 1;
    }
    pVVar4 = pVVar4 + 2;
    pVVar6 = pVVar6 + 2;
  }
  pdVar1 = &resultIntervals[0].m_hi;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    local_198->m_data[lVar2] = (float)pdVar1[-1];
    resultMax->m_data[lVar2] = (float)*pdVar1;
    pdVar1 = pdVar1 + 3;
  }
  return;
}

Assistant:

void SampleVerifier::getFilteredSample2D (const IVec3&	texelBase,
										  const Vec2&	weights,
										  int			layer,
										  int			level,
										  Vec4&			resultMin,
										  Vec4&			resultMax) const
{
	Vec4 texelsMin[4];
	Vec4 texelsMax[4];

	for (int i = 0; i < 2; ++i)
	{
		for (int j = 0; j < 2; ++j)
		{
		    fetchTexel(texelBase + IVec3(i, j, 0), layer, level, VK_FILTER_LINEAR, texelsMin[2 * j + i], texelsMax[2 * j + i]);
		}
	}

	Interval resultIntervals[4];

	for (int ndx = 0; ndx < 4; ++ndx)
	{
		resultIntervals[ndx] = Interval(0.0);
	}

	for (int i = 0; i < 2; ++i)
	{
		const Interval iWeightInterval = m_filteringPrecision.roundOut(Interval(i == 0 ? 1.0f - weights[1] : weights[1]), false);

		for (int j = 0; j < 2; ++j)
		{
		    const Interval jWeightInterval = m_filteringPrecision.roundOut(iWeightInterval * Interval(j == 0 ? 1.0f - weights[0] : weights[0]), false);

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				const Interval texelInterval(false, texelsMin[2 * i + j][compNdx], texelsMax[2 * i + j][compNdx]);

				resultIntervals[compNdx] = m_filteringPrecision.roundOut(resultIntervals[compNdx] + jWeightInterval * texelInterval, false);
			}
		}
	}

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		resultMin[compNdx] = (float)resultIntervals[compNdx].lo();
		resultMax[compNdx] = (float)resultIntervals[compNdx].hi();
	}
}